

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O1

void CompareSilfTables(int *ec,TestCase *ptcase,GrIStream *grstrmB,GrIStream *grstrmT,
                      int *pchwMaxGlyphID)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  _Alloc_hider _Var13;
  GrIStream *pGVar14;
  ulong uVar15;
  long local_fc8;
  long lSubTableStartT;
  long lSubTableStartB;
  int local_fb0;
  int local_fac;
  long local_fa8;
  string local_fa0;
  string local_f80;
  string local_f60;
  string local_f40;
  string local_f20;
  string local_f00;
  string local_ee0;
  long local_ec0;
  string local_eb8;
  string local_e98;
  string local_e78;
  string local_e58;
  string local_e38;
  string local_e18;
  string local_df8;
  string local_dd8;
  string local_db8;
  string local_d98;
  string local_d78;
  string local_d58;
  string local_d38;
  string local_d18;
  string local_cf8;
  string local_cd8;
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  int rgnPassOffsets [128];
  int nSubTableOffsetsT [256];
  int nSubTableOffsetsB [256];
  
  iVar2 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
  local_fac = 0x10000;
  if (0x10000 < iVar2) {
    local_fac = iVar2;
  }
  iVar3 = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
  iVar6 = 0x10000;
  if (0x10000 < iVar3) {
    iVar6 = iVar3;
  }
  if (0x50000 < iVar3) {
    local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a58,"ERROR: Unknown Silf table version in test font","");
    OutputError(ec,ptcase,&local_a58,-1);
    _Var13._M_p = local_a58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a58._M_dataplus._M_p == &local_a58.field_2) {
      return;
    }
LAB_0010473f:
    operator_delete(_Var13._M_p,local_a58.field_2._M_allocated_capacity + 1);
    return;
  }
  if (0x2ffff < iVar2) {
    (*grstrmB->_vptr_GrIStream[4])(grstrmB);
  }
  local_fb0 = iVar6;
  if (0x2ffff < iVar3) {
    (*grstrmT->_vptr_GrIStream[4])(grstrmT);
  }
  uVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  uVar5 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if ((short)uVar5 != 1) {
    if ((uVar5 & 0xffff) == 0) {
      local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a78,"ERROR: Silf table has no subtable","");
      OutputError(ec,ptcase,&local_a78,-1);
      local_a58.field_2._M_allocated_capacity = local_a78.field_2._M_allocated_capacity;
      _Var13._M_p = local_a78._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a78._M_dataplus._M_p == &local_a78.field_2) {
        return;
      }
      goto LAB_0010473f;
    }
    local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a98,"ERROR: Silf table has greater than 1 subtable","");
    OutputError(ec,ptcase,&local_a98,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
      operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
    }
  }
  if (0x1ffff < iVar2) {
    (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  }
  if (0x1ffff < iVar3) {
    (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  }
  if ((short)uVar4 != 0) {
    uVar15 = 0;
    do {
      iVar6 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
      nSubTableOffsetsB[uVar15] = iVar6;
      uVar15 = uVar15 + 1;
    } while ((uVar4 & 0xffff) != uVar15);
  }
  if ((short)uVar5 != 0) {
    uVar15 = 0;
    do {
      iVar6 = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
      nSubTableOffsetsT[uVar15] = iVar6;
      uVar15 = uVar15 + 1;
    } while ((uVar5 & 0xffff) != uVar15);
  }
  (*grstrmB->_vptr_GrIStream[7])(grstrmB,(long)nSubTableOffsetsB[0]);
  (*grstrmT->_vptr_GrIStream[7])(grstrmT,(long)nSubTableOffsetsT[0]);
  (*grstrmB->_vptr_GrIStream[6])(grstrmB,&lSubTableStartB);
  (*grstrmT->_vptr_GrIStream[6])(grstrmT,&lSubTableStartT);
  if (0x2ffff < iVar2) {
    (*grstrmB->_vptr_GrIStream[4])(grstrmB);
  }
  if (0x2ffff < iVar3) {
    (*grstrmT->_vptr_GrIStream[4])(grstrmT);
  }
  local_fa8 = -1;
  local_ec0 = -1;
  local_fc8 = -1;
  if (0x2ffff < iVar2) {
    uVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
    local_fc8 = (ulong)(uVar4 & 0xffff) + CONCAT44(lSubTableStartB._4_4_,(int)lSubTableStartB);
    uVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
    local_ec0 = (ulong)(uVar4 & 0xffff) + CONCAT44(lSubTableStartB._4_4_,(int)lSubTableStartB);
  }
  lVar11 = -1;
  if (0x2ffff < iVar3) {
    uVar4 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
    lVar11 = (ulong)(uVar4 & 0xffff) + CONCAT44(lSubTableStartT._4_4_,(int)lSubTableStartT);
    uVar4 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
    local_fa8 = (ulong)(uVar4 & 0xffff) + CONCAT44(lSubTableStartT._4_4_,(int)lSubTableStartT);
  }
  uVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  *pchwMaxGlyphID = uVar4 & 0xffff;
  uVar4 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if (*pchwMaxGlyphID != (uVar4 & 0xffff)) {
    local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ab8,"ERROR: Silf table - maxiumum glyph ID","");
    OutputError(ec,ptcase,&local_ab8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
      operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
    }
    *pchwMaxGlyphID = -1;
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)iVar6 != (short)iVar7) {
    local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ad8,"ERROR: Silf table - extra ascent","");
    OutputError(ec,ptcase,&local_ad8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
      operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
  if ((short)iVar6 != (short)iVar7) {
    local_af8._M_dataplus._M_p = (pointer)&local_af8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_af8,"ERROR: Silf table - extra descent","");
    OutputError(ec,ptcase,&local_af8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
      operator_delete(local_af8._M_dataplus._M_p,local_af8.field_2._M_allocated_capacity + 1);
    }
  }
  uVar4 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar6 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)uVar4 != (char)iVar6) {
    local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b18,"ERROR: Silf table - number of passes","");
    OutputError(ec,ptcase,&local_b18,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
      operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b38,"ERROR: Silf table - first substitution pass","");
    OutputError(ec,ptcase,&local_b38,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
      operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_b58._M_dataplus._M_p = (pointer)&local_b58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b58,"ERROR: Silf table - first positioning pass","");
    OutputError(ec,ptcase,&local_b58,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b58._M_dataplus._M_p != &local_b58.field_2) {
      operator_delete(local_b58._M_dataplus._M_p,local_b58.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b78,"ERROR: Silf table - first justification pass","");
    OutputError(ec,ptcase,&local_b78,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
      operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b98,"ERROR: Silf table - first reordered pass","");
    OutputError(ec,ptcase,&local_b98,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
      operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_bb8._M_dataplus._M_p = (pointer)&local_bb8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_bb8,"ERROR: Silf table - flags","");
    OutputError(ec,ptcase,&local_bb8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bb8._M_dataplus._M_p != &local_bb8.field_2) {
      operator_delete(local_bb8._M_dataplus._M_p,local_bb8.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_bd8,"ERROR: Silf table - pre LB context","");
    OutputError(ec,ptcase,&local_bd8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
      operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_bf8._M_dataplus._M_p = (pointer)&local_bf8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_bf8,"ERROR: Silf table - post LB context","");
    OutputError(ec,ptcase,&local_bf8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
      operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_c18._M_dataplus._M_p = (pointer)&local_c18.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c18,"ERROR: Silf table - actual-for-pseudo attr","");
    OutputError(ec,ptcase,&local_c18,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
      operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_c38._M_dataplus._M_p = (pointer)&local_c38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c38,"ERROR: Silf table - breakweight attr","");
    OutputError(ec,ptcase,&local_c38,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
      operator_delete(local_c38._M_dataplus._M_p,local_c38.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_c58._M_dataplus._M_p = (pointer)&local_c58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c58,"ERROR: Silf table - directionality attr","");
    OutputError(ec,ptcase,&local_c58,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
      operator_delete(local_c58._M_dataplus._M_p,local_c58.field_2._M_allocated_capacity + 1);
    }
  }
  if (iVar2 < 0x20000 || iVar3 < 0x20000) {
    if (iVar2 < 0x20000) {
      if (0x1ffff < iVar3) {
        (*grstrmB->_vptr_GrIStream[1])(grstrmB);
        (*grstrmB->_vptr_GrIStream[1])(grstrmB);
        uVar5 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
        if ((char)uVar5 != '\0') {
          local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_cf8,
                     "ERROR: Silf table - justification data found but not expected","");
          OutputError(ec,ptcase,&local_cf8,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
            operator_delete(local_cf8._M_dataplus._M_p,local_cf8.field_2._M_allocated_capacity + 1);
          }
        }
        uVar5 = uVar5 & 0xff;
        if (uVar5 != 0) {
          do {
            (*grstrmB->_vptr_GrIStream[5])(grstrmB,rgnPassOffsets,8);
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
      }
    }
    else {
      (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      uVar5 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      if ((char)uVar5 != '\0') {
        local_cd8._M_dataplus._M_p = (pointer)&local_cd8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_cd8,"ERROR: Silf table - missing justification data","");
        OutputError(ec,ptcase,&local_cd8,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
          operator_delete(local_cd8._M_dataplus._M_p,local_cd8.field_2._M_allocated_capacity + 1);
        }
      }
      uVar5 = uVar5 & 0xff;
      if (uVar5 != 0) {
        do {
          (*grstrmB->_vptr_GrIStream[5])(grstrmB,rgnPassOffsets,8);
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
    }
  }
  else {
    iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
    iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
    if (iVar2 < 0x40000) {
      (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      (*grstrmT->_vptr_GrIStream[1])(grstrmT);
    }
    else {
      if ((char)iVar6 != (char)iVar7) {
        local_c78._M_dataplus._M_p = (pointer)&local_c78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c78,"ERROR: Silf table - mirroring attrs","");
        OutputError(ec,ptcase,&local_c78,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c78._M_dataplus._M_p != &local_c78.field_2) {
          operator_delete(local_c78._M_dataplus._M_p,local_c78.field_2._M_allocated_capacity + 1);
        }
      }
      iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      if ((char)iVar6 != (char)iVar7) {
        local_c98._M_dataplus._M_p = (pointer)&local_c98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c98,"ERROR: Silf table - skip-passes attr","");
        OutputError(ec,ptcase,&local_c98,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c98._M_dataplus._M_p != &local_c98.field_2) {
          operator_delete(local_c98._M_dataplus._M_p,local_c98.field_2._M_allocated_capacity + 1);
        }
      }
    }
    uVar5 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
    iVar6 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
    if ((char)uVar5 == (char)iVar6) {
      if ((uVar5 & 0xff) != 0) {
        uVar12 = 0;
        do {
          iVar7 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
          iVar8 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
          if ((char)iVar7 != (char)iVar8) {
            local_ee0._M_dataplus._M_p = (pointer)&local_ee0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_ee0,"ERROR: Silf table - stretch","");
            OutputError(ec,ptcase,&local_ee0,uVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ee0._M_dataplus._M_p != &local_ee0.field_2) {
              operator_delete(local_ee0._M_dataplus._M_p,local_ee0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          iVar7 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
          iVar8 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
          if ((char)iVar7 != (char)iVar8) {
            local_f00._M_dataplus._M_p = (pointer)&local_f00.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f00,"ERROR: Silf table - shrink","");
            OutputError(ec,ptcase,&local_f00,uVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f00._M_dataplus._M_p != &local_f00.field_2) {
              operator_delete(local_f00._M_dataplus._M_p,local_f00.field_2._M_allocated_capacity + 1
                             );
            }
          }
          iVar7 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
          iVar8 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
          if ((char)iVar7 != (char)iVar8) {
            local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f20,"ERROR: Silf table - step","");
            OutputError(ec,ptcase,&local_f20,uVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f20._M_dataplus._M_p != &local_f20.field_2) {
              operator_delete(local_f20._M_dataplus._M_p,local_f20.field_2._M_allocated_capacity + 1
                             );
            }
          }
          iVar7 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
          iVar8 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
          if ((char)iVar7 != (char)iVar8) {
            local_f40._M_dataplus._M_p = (pointer)&local_f40.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f40,"ERROR: Silf table - weight","");
            OutputError(ec,ptcase,&local_f40,uVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f40._M_dataplus._M_p != &local_f40.field_2) {
              operator_delete(local_f40._M_dataplus._M_p,local_f40.field_2._M_allocated_capacity + 1
                             );
            }
          }
          (*grstrmB->_vptr_GrIStream[1])(grstrmB);
          (*grstrmT->_vptr_GrIStream[1])(grstrmT);
          (*grstrmB->_vptr_GrIStream[1])(grstrmB);
          (*grstrmB->_vptr_GrIStream[1])(grstrmB);
          (*grstrmB->_vptr_GrIStream[1])(grstrmB);
          (*grstrmT->_vptr_GrIStream[1])(grstrmT);
          (*grstrmT->_vptr_GrIStream[1])(grstrmT);
          (*grstrmT->_vptr_GrIStream[1])(grstrmT);
          uVar12 = uVar12 + 1;
        } while ((uVar5 & 0xff) != uVar12);
      }
    }
    else {
      local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_cb8,"ERROR: Silf table - justification levels","");
      OutputError(ec,ptcase,&local_cb8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
        operator_delete(local_cb8._M_dataplus._M_p,local_cb8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((char)uVar5 != (char)iVar6) {
      return;
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if ((short)iVar6 != (short)iVar7) {
    local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d18,"ERROR: Silf table - number of components","");
    OutputError(ec,ptcase,&local_d18,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
      operator_delete(local_d18._M_dataplus._M_p,local_d18.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d38,"ERROR: Silf table - number of user-defined slot attributes","")
    ;
    OutputError(ec,ptcase,&local_d38,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
      operator_delete(local_d38._M_dataplus._M_p,local_d38.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_d58._M_dataplus._M_p = (pointer)&local_d58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d58,"ERROR: Silf table - max number of ligature components","");
    OutputError(ec,ptcase,&local_d58,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d58._M_dataplus._M_p != &local_d58.field_2) {
      operator_delete(local_d58._M_dataplus._M_p,local_d58.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)iVar6 != (char)iVar7) {
    local_d78._M_dataplus._M_p = (pointer)&local_d78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d78,"ERROR: Silf table - supported directions","");
    OutputError(ec,ptcase,&local_d78,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d78._M_dataplus._M_p != &local_d78.field_2) {
      operator_delete(local_d78._M_dataplus._M_p,local_d78.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((0x40000 < iVar2) && ((char)iVar6 != (char)iVar7)) {
    local_d98._M_dataplus._M_p = (pointer)&local_d98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d98,"ERROR: Silf table - collision attributes","");
    OutputError(ec,ptcase,&local_d98,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d98._M_dataplus._M_p != &local_d98.field_2) {
      operator_delete(local_d98._M_dataplus._M_p,local_d98.field_2._M_allocated_capacity + 1);
    }
  }
  (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  pGVar14 = grstrmT;
  if (iVar2 < 0x20000 || iVar3 < 0x20000) {
    if (iVar2 < 0x20000) {
      if (iVar3 < 0x20000) goto LAB_00105875;
      (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      iVar6 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
      if ((char)iVar6 != '\0') {
        local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_df8,
                   "ERROR: Silf table - critical features found but not expected","");
        OutputError(ec,ptcase,&local_df8,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
          operator_delete(local_df8._M_dataplus._M_p,local_df8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
      pGVar14 = grstrmB;
      if ((char)iVar6 != '\0') {
        local_dd8._M_dataplus._M_p = (pointer)&local_dd8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_dd8,"ERROR: Silf table - critical features not equal to zero",""
                  );
        OutputError(ec,ptcase,&local_dd8,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
          operator_delete(local_dd8._M_dataplus._M_p,local_dd8.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  else {
    (*grstrmB->_vptr_GrIStream[1])(grstrmB);
    (*grstrmT->_vptr_GrIStream[1])(grstrmT);
    iVar6 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
    iVar7 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
    if ((char)iVar6 != (char)iVar7) {
      local_db8._M_dataplus._M_p = (pointer)&local_db8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_db8,"ERROR: Silf table - critical features","");
      OutputError(ec,ptcase,&local_db8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_db8._M_dataplus._M_p != &local_db8.field_2) {
        operator_delete(local_db8._M_dataplus._M_p,local_db8.field_2._M_allocated_capacity + 1);
      }
    }
    (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  }
  (*pGVar14->_vptr_GrIStream[1])();
LAB_00105875:
  uVar5 = (*grstrmB->_vptr_GrIStream[1])(grstrmB);
  uVar12 = (*grstrmT->_vptr_GrIStream[1])(grstrmT);
  if ((char)uVar5 != (char)uVar12) {
    local_e18._M_dataplus._M_p = (pointer)&local_e18.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e18,"ERROR: Silf table - rendering behaviors","");
    OutputError(ec,ptcase,&local_e18,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e18._M_dataplus._M_p != &local_e18.field_2) {
      operator_delete(local_e18._M_dataplus._M_p,local_e18.field_2._M_allocated_capacity + 1);
    }
  }
  uVar12 = uVar12 & 0xff;
  for (uVar5 = uVar5 & 0xff; uVar5 != 0; uVar5 = uVar5 - 1) {
    (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  }
  for (; uVar12 != 0; uVar12 = uVar12 - 1) {
    (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if ((short)iVar6 != (short)iVar7) {
    local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e38,"ERROR: Silf table - linebreak glyph ID","");
    OutputError(ec,ptcase,&local_e38,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
      operator_delete(local_e38._M_dataplus._M_p,local_e38.field_2._M_allocated_capacity + 1);
    }
  }
  if (0x2ffff < iVar2) {
    (*grstrmB->_vptr_GrIStream[7])(grstrmB,local_fc8);
  }
  if (0x2ffff < iVar3) {
    (*grstrmT->_vptr_GrIStream[7])(grstrmT,lVar11);
  }
  bVar1 = true;
  uVar15 = 0;
  do {
    iVar6 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
    rgnPassOffsets[uVar15] = iVar6;
    iVar7 = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
    if (iVar6 != iVar7) {
      local_f60._M_dataplus._M_p = (pointer)&local_f60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f60,"ERROR: Silf table - pass offsets","");
      OutputError(ec,ptcase,&local_f60,(int)uVar15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f60._M_dataplus._M_p != &local_f60.field_2) {
        operator_delete(local_f60._M_dataplus._M_p,local_f60.field_2._M_allocated_capacity + 1);
      }
      bVar1 = false;
    }
    uVar15 = uVar15 + 1;
  } while ((uVar4 & 0xff) + 1 != uVar15);
  if (0x2ffff < iVar2) {
    (*grstrmB->_vptr_GrIStream[7])(grstrmB,local_ec0);
  }
  if (0x2ffff < iVar3) {
    (*grstrmT->_vptr_GrIStream[7])(grstrmT,local_fa8);
  }
  uVar5 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  iVar6 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if ((short)uVar5 != (short)iVar6) {
    local_e58._M_dataplus._M_p = (pointer)&local_e58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e58,"ERROR: Silf table - pseudo search count","");
    OutputError(ec,ptcase,&local_e58,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e58._M_dataplus._M_p != &local_e58.field_2) {
      operator_delete(local_e58._M_dataplus._M_p,local_e58.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if ((short)iVar6 != (short)iVar7) {
    local_e78._M_dataplus._M_p = (pointer)&local_e78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e78,"ERROR: Silf table - pseudo search increment","");
    OutputError(ec,ptcase,&local_e78,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e78._M_dataplus._M_p != &local_e78.field_2) {
      operator_delete(local_e78._M_dataplus._M_p,local_e78.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if ((short)iVar6 != (short)iVar7) {
    local_e98._M_dataplus._M_p = (pointer)&local_e98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e98,"ERROR: Silf table - pseudo search loop","");
    OutputError(ec,ptcase,&local_e98,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e98._M_dataplus._M_p != &local_e98.field_2) {
      operator_delete(local_e98._M_dataplus._M_p,local_e98.field_2._M_allocated_capacity + 1);
    }
  }
  iVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
  iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
  if ((short)iVar6 != (short)iVar7) {
    local_eb8._M_dataplus._M_p = (pointer)&local_eb8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_eb8,"ERROR: Silf table - pseudo search start","");
    OutputError(ec,ptcase,&local_eb8,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_eb8._M_dataplus._M_p != &local_eb8.field_2) {
      operator_delete(local_eb8._M_dataplus._M_p,local_eb8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((uVar5 & 0xffff) != 0) {
    uVar12 = 0;
    do {
      if (iVar2 < 0x10001) {
        uVar9 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
        uVar9 = uVar9 & 0xffff;
      }
      else {
        uVar9 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
      }
      if (iVar3 < 0x10001) {
        uVar10 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
        uVar10 = uVar10 & 0xffff;
      }
      else {
        uVar10 = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
      }
      if (uVar9 != uVar10) {
        local_f80._M_dataplus._M_p = (pointer)&local_f80.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f80,"ERROR: Silf table - unicode for pseudo","");
        OutputError(ec,ptcase,&local_f80,uVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f80._M_dataplus._M_p != &local_f80.field_2) {
          operator_delete(local_f80._M_dataplus._M_p,local_f80.field_2._M_allocated_capacity + 1);
        }
      }
      iVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
      iVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
      if ((short)iVar6 != (short)iVar7) {
        local_fa0._M_dataplus._M_p = (pointer)&local_fa0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_fa0,"ERROR: Silf table = pseudo value","");
        OutputError(ec,ptcase,&local_fa0,uVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_fa0._M_dataplus._M_p != &local_fa0.field_2) {
          operator_delete(local_fa0._M_dataplus._M_p,local_fa0.field_2._M_allocated_capacity + 1);
        }
      }
      uVar12 = uVar12 + 1;
    } while ((uVar5 & 0xffff) != uVar12);
  }
  iVar2 = local_fac;
  CompareClassMaps(ec,ptcase,grstrmB,grstrmT,local_fac);
  if (bVar1) {
    ComparePasses(ec,ptcase,grstrmB,grstrmT,iVar2,local_fb0,uVar4 & 0xff,(int)lSubTableStartB,
                  (int)lSubTableStartT,rgnPassOffsets);
  }
  return;
}

Assistant:

void CompareSilfTables(int & ec, TestCase * ptcase, GrIStream & grstrmB, GrIStream & grstrmT,
	int * pchwMaxGlyphID)
{
	int fxdSilfVersionB = ReadVersion(grstrmB);
	int fxdSilfVersionT = ReadVersion(grstrmT);

	Assert(fxdSilfVersionB <= kSilfVersion);
	if (fxdSilfVersionT > kSilfVersion)
	{
		OutputError(ec, ptcase, "ERROR: Unknown Silf table version in test font");
		return;
	}

	if (fxdSilfVersionB >= 0x00030000)
		 // compiler version
		grstrmB.ReadIntFromFont();
	if (fxdSilfVersionT >= 0x00030000)
		grstrmT.ReadIntFromFont();

	//	number of tables
	unsigned short cSubTablesB = grstrmB.ReadUShortFromFont();
	Assert(cSubTablesB == 1);	// for now
	Assert(cSubTablesB <= kMaxSubTablesInFont);
	unsigned short cSubTablesT = grstrmT.ReadUShortFromFont();
	if (cSubTablesT < 1)
	{
		OutputError(ec, ptcase, "ERROR: Silf table has no subtable");
		return;
	}
	if (cSubTablesT > 1)
		OutputError(ec, ptcase, "ERROR: Silf table has greater than 1 subtable");

    if (fxdSilfVersionB >= 0x00020000)
		// reserved
		grstrmB.ReadShortFromFont();
	if (fxdSilfVersionT >= 0x00020000)
		grstrmT.ReadShortFromFont();

	//	subtable offsets
	int nSubTableOffsetsB[kMaxSubTablesInFont];
	int nSubTableOffsetsT[kMaxSubTablesInFont];
	int i;
	for (i = 0; i < cSubTablesB; i++)
		nSubTableOffsetsB[i] = grstrmB.ReadIntFromFont();
	for (i = 0; i < cSubTablesT; i++)
		nSubTableOffsetsT[i] = grstrmT.ReadIntFromFont();
	grstrmB.SetPositionInFont(nSubTableOffsetsB[0]);
	grstrmT.SetPositionInFont(nSubTableOffsetsT[0]);

	//	Now we are at the beginning of the desired sub-table.

	//	Get the position of the start of the table.
	long lSubTableStartB, lSubTableStartT;
	grstrmB.GetPositionInFont(&lSubTableStartB);
	grstrmT.GetPositionInFont(&lSubTableStartT);

	//	rule version
	uint32_t fxdRuleVersionB = (fxdSilfVersionB >= 0x00030000) ? ReadVersion(grstrmB) : fxdSilfVersionB;
	uint32_t fxdRuleVersionT = (fxdSilfVersionT >= 0x00030000) ? ReadVersion(grstrmT) : fxdSilfVersionT;

	long lPassBlockPosB = -1;
	long lPseudosPosB = -1;
	if (fxdSilfVersionB >= 0x00030000)
	{
		lPassBlockPosB = grstrmB.ReadUShortFromFont() + lSubTableStartB;
		lPseudosPosB = grstrmB.ReadUShortFromFont() + lSubTableStartB;
	}
	long lPassBlockPosT = -1;
	long lPseudosPosT = -1;
	if (fxdSilfVersionT >= 0x00030000)
	{
		lPassBlockPosT = grstrmT.ReadUShortFromFont() + lSubTableStartT;
		lPseudosPosT = grstrmT.ReadUShortFromFont() + lSubTableStartT;
	}

	//	maximum glyph ID
	*pchwMaxGlyphID = grstrmB.ReadUShortFromFont();
	if (grstrmT.ReadUShortFromFont() != *pchwMaxGlyphID)
	{
		OutputError(ec, ptcase, "ERROR: Silf table - maxiumum glyph ID");
		*pchwMaxGlyphID = -1;
	}

	//	extra ascent
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - extra ascent");
	// extra descent
	if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - extra descent");

	//	number of passes
	gr::byte cPasses = grstrmB.ReadByteFromFont();
	if (cPasses != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - number of passes");
	//	index of first substitution pass
	gr::byte ipassSub1 = grstrmB.ReadByteFromFont();
	if (ipassSub1 != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - first substitution pass");
	//	index of first positioning pass
	gr::byte ipassPos1 = grstrmB.ReadByteFromFont();
	if (ipassPos1 != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - first positioning pass");
	//	index of first justification pass
	gr::byte ipassJust1 = grstrmB.ReadByteFromFont();
	if (ipassJust1 != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - first justification pass");
	//	index of first reordered pass, or 0xFF if no reordering
	gr::byte ipassReordered1 = grstrmB.ReadByteFromFont();
	if (ipassReordered1 != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - first reordered pass");

	gr::byte bT, bB;
	//	flags
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - flags");

	//	range of possible cross-line-boundary contextualization
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - pre LB context");
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - post LB context");

	//	actual glyph ID for pseudo-glyph (ID of bogus attribute)
	//long posB; grstrmB.GetPositionInFont(&posB); - debuggers
	//WriteToLog("benchmark position = ", posB, "; ");
	//long posT; grstrmT.GetPositionInFont(&posT);
	//WriteToLog("test font position = ", posT, "; ");
	//gr::byte tempB = grstrmB.ReadByteFromFont();
	//WriteToLog("next byte B = ", tempB, "; ");
	//gr::byte tempT = grstrmT.ReadByteFromFont();
	//WriteToLog("next byte T = ", tempT, "\n");
	//if (tempB != tempT)
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - actual-for-pseudo attr");
	//	breakweight
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - breakweight attr");
	//	directionality
	if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
		OutputError(ec, ptcase, "ERROR: Silf table - directionality attr");

	if (fxdSilfVersionB >= 0x00020000 && fxdSilfVersionT >= 0x00020000)
	{
		if (fxdSilfVersionB >= 0x00040000) {
			if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
				OutputError(ec, ptcase, "ERROR: Silf table - mirroring attrs");
			if ((bB = grstrmB.ReadByteFromFont()) != (bT = grstrmT.ReadByteFromFont()))
				OutputError(ec, ptcase, "ERROR: Silf table - skip-passes attr");
		}
		else
		{
			// reserved
			grstrmB.ReadByteFromFont();
			grstrmT.ReadByteFromFont();

			grstrmB.ReadByteFromFont();
			grstrmT.ReadByteFromFont();
		}		

		//	justification levels
		int cJLevels = grstrmB.ReadByteFromFont();
		if (cJLevels != grstrmT.ReadByteFromFont())
		{
			OutputError(ec, ptcase, "ERROR: Silf table - justification levels");
			return;
		}
		for (int i = 0; i < cJLevels; i++)
		{
			//	justification glyph attribute IDs
			if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
				OutputError(ec, ptcase, "ERROR: Silf table - stretch", i);
			if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
				OutputError(ec, ptcase, "ERROR: Silf table - shrink", i);
			if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
				OutputError(ec, ptcase, "ERROR: Silf table - step", i);
			if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
				OutputError(ec, ptcase, "ERROR: Silf table - weight", i);
			grstrmB.ReadByteFromFont(); // runto
			grstrmT.ReadByteFromFont();
			// reserved
			grstrmB.ReadByteFromFont();
			grstrmB.ReadByteFromFont();
			grstrmB.ReadByteFromFont();

			grstrmT.ReadByteFromFont();
			grstrmT.ReadByteFromFont();
			grstrmT.ReadByteFromFont();
		}
	}
	else if (fxdSilfVersionB >= 0x00020000)
	{
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmB.ReadByteFromFont();
		//	justification levels
		int cJLevels = grstrmB.ReadByteFromFont();
		if (cJLevels > 0)
			OutputError(ec, ptcase, "ERROR: Silf table - missing justification data");
		gr::byte rgb[8];
		for (int i = 0; i < cJLevels; i++)
			grstrmB.ReadBlockFromFont(rgb, 8);
	}
	else if (fxdSilfVersionT >= 0x00020000)
	{
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmB.ReadByteFromFont();
		//	justification levels
		int cJLevels = grstrmB.ReadByteFromFont();
		if (cJLevels > 0)
			OutputError(ec, ptcase, "ERROR: Silf table - justification data found but not expected");
		gr::byte rgb[8];
		for (int i = 0; i < cJLevels; i++)
			grstrmB.ReadBlockFromFont(rgb, 8);
	}

	//	number of component attributes
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - number of components");

	//	number of user-defined slot attributes
	if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - number of user-defined slot attributes");

	//	max number of ligature components per glyph
	if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - max number of ligature components");

	//	directions supported
	if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - supported directions");

	if (fxdSilfVersionB >= 0x00040001)
	{
		if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
			OutputError(ec, ptcase, "ERROR: Silf table - collision attributes");
	}
	else
	{
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmT.ReadByteFromFont();
	}

	//	reserved
	grstrmB.ReadByteFromFont();
	grstrmB.ReadByteFromFont();
	grstrmT.ReadByteFromFont();
	grstrmT.ReadByteFromFont();

	//	critical features
	if (fxdSilfVersionB >= 0x00020000 && fxdSilfVersionT >= 0x00020000)
	{
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmT.ReadByteFromFont();
		// critical features
		if (grstrmB.ReadByteFromFont() != grstrmT.ReadByteFromFont())
			OutputError(ec, ptcase, "ERROR: Silf table - critical features");
		// reserved
		grstrmB.ReadByteFromFont();
		grstrmT.ReadByteFromFont();
	}
	else if (fxdSilfVersionB >= 0x00020000)
	{
		grstrmB.ReadByteFromFont();
		if (grstrmB.ReadByteFromFont() != 0)
			OutputError(ec, ptcase, "ERROR: Silf table - critical features not equal to zero");
		grstrmB.ReadByteFromFont();
	}
	else if (fxdSilfVersionT >= 0x00020000)
	{
		grstrmT.ReadByteFromFont();
		if (grstrmT.ReadByteFromFont() != 0)
			OutputError(ec, ptcase, "ERROR: Silf table - critical features found but not expected");
		grstrmT.ReadByteFromFont();
	}

	//	rendering behaviors
	int cBehaviorsB = grstrmB.ReadByteFromFont();
	int cBehaviorsT = grstrmT.ReadByteFromFont();
	if (cBehaviorsB != cBehaviorsT)
		OutputError(ec, ptcase, "ERROR: Silf table - rendering behaviors");
	for (i = 0; i < cBehaviorsB; i++)
		grstrmB.ReadUShortFromFont();
	for (i = 0; i < cBehaviorsT; i++)
		grstrmT.ReadUShortFromFont();

	//	linebreak glyph ID
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - linebreak glyph ID");

	//	Jump to the beginning of the pass offset block, if we have this information.
	if (fxdSilfVersionB >= 0x00030000)
		grstrmB.SetPositionInFont(lPassBlockPosB);
	else
		//	Otherwise assume that's where we are!
		Assert(lPassBlockPosB == -1);

	if (fxdSilfVersionT >= 0x00030000)
		grstrmT.SetPositionInFont(lPassBlockPosT);
	else
		Assert(lPassBlockPosT == -1);

	//	offsets to passes, relative to the start of this subtable;
	//	note that we read (cPasses + 1) of these
	int rgnPassOffsets[kMaxPasses];
	bool fPassesOk = true;
	for (i = 0; i <= cPasses; i++)
	{
		rgnPassOffsets[i] = grstrmB.ReadIntFromFont();
		if (rgnPassOffsets[i] != grstrmT.ReadIntFromFont())
		{
			OutputError(ec, ptcase, "ERROR: Silf table - pass offsets", i);
			fPassesOk = false;
		}
	}

	//	Jump to the beginning of the pseudo-glyph info block, if we have this information.
	if (fxdSilfVersionB >= 0x00030000)
		grstrmB.SetPositionInFont(lPseudosPosB);
	else
		//	Otherwise assume that's where we are!
		Assert(lPseudosPosB == -1);

	if (fxdSilfVersionT >= 0x00030000)
		grstrmT.SetPositionInFont(lPseudosPosT);
	else
		Assert(lPseudosPosT == -1);

	//	number of pseudo-glyphs and search constants
	int cpsd = grstrmB.ReadUShortFromFont();
	if (cpsd != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - pseudo search count");
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - pseudo search increment");
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - pseudo search loop");
	if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
		OutputError(ec, ptcase, "ERROR: Silf table - pseudo search start");

	//	unicode-to-pseudo map
	for (i = 0; i < cpsd; i++)
	{
		int unicodeB, unicodeT;
		if (fxdSilfVersionB <= 0x00010000)
			unicodeB = grstrmB.ReadUShortFromFont();
		else
			unicodeB = grstrmB.ReadIntFromFont();
		if (fxdSilfVersionT <= 0x00010000)
			unicodeT = grstrmT.ReadUShortFromFont();
		else
			unicodeT = grstrmT.ReadIntFromFont();
		if (unicodeB != unicodeT)
			OutputError(ec, ptcase, "ERROR: Silf table - unicode for pseudo", i);

		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: Silf table = pseudo value", i);
	}

	CompareClassMaps(ec, ptcase, grstrmB, grstrmT, fxdSilfVersionB);

	if (fPassesOk)
		ComparePasses(ec, ptcase, grstrmB, grstrmT,
			fxdSilfVersionB, fxdSilfVersionT, cPasses,
			lSubTableStartB, lSubTableStartT, rgnPassOffsets);
}